

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VTuneChakraProfile.cpp
# Opt level: O2

void VTuneChakraProfile::LogMethodNativeLoadEvent
               (FunctionBody *body,FunctionEntryPointInfo *entryPoint)

{
  code *pcVar1;
  ExecutionMode EVar2;
  bool bVar3;
  ULONG UVar4;
  uint32 uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  char16 *_Src;
  size_t sVar9;
  undefined4 *puVar10;
  HeapAllocator *pHVar11;
  ptrdiff_t pVar12;
  TrackAllocData *obj;
  utf8char_t *buffer;
  ulong uVar13;
  WCHAR local_2f8 [4];
  char16 methodNameBuffer [260];
  char16_t local_e8 [4];
  char16 numberBuffer [20];
  undefined1 local_b8 [8];
  TrackAllocData data;
  size_t urlLength;
  utf8char_t *puStack_80;
  DWORD_PTR local_78;
  undefined8 uStack_70;
  TrackAllocData *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  utf8char_t *puStack_50;
  ulong local_48;
  utf8char_t *local_40;
  ULONG local_34;
  
  if (isJitProfilingActive) {
    local_58 = 0;
    puStack_50 = (utf8char_t *)0x0;
    local_68 = (TrackAllocData *)0x0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    urlLength = 0;
    puStack_80 = (utf8char_t *)0x0;
    _Src = Js::ParseableFunctionInfo::GetExternalDisplayName(&body->super_ParseableFunctionInfo);
    UVar4 = Js::ParseableFunctionInfo::GetLineNumber(&body->super_ParseableFunctionInfo);
    _ltow((ulong)UVar4,local_e8,10);
    wcscpy_s<260ul>((WCHAR (*) [260])local_2f8,_Src);
    EVar2 = Js::FunctionEntryPointInfo::GetJitMode(entryPoint);
    if (EVar2 == SimpleJit) {
      wcscat_s<260ul>((WCHAR (*) [260])local_2f8,L" Simple");
    }
    wcscat_s<260ul>((WCHAR (*) [260])local_2f8,L" {line:");
    wcscat_s<260ul>((WCHAR (*) [260])local_2f8,local_e8);
    wcscat_s<260ul>((WCHAR (*) [260])local_2f8,L"}");
    sVar9 = PAL_wcslen((char16_t *)local_2f8);
    if (0x103 < sVar9) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/VTuneChakraProfile.cpp"
                         ,0x42,"(methodLength < 260)","methodLength < _MAX_PATH");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar10 = 0;
    }
    local_34 = UVar4;
    uVar5 = UInt32Math::MulAdd<3u,1u>((uint32)sVar9);
    uVar13 = (ulong)uVar5;
    local_b8 = (undefined1  [8])&unsigned_char::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_31dec53;
    data.filename._0_4_ = 0x45;
    data.plusSize = uVar13;
    pHVar11 = Memory::HeapAllocator::TrackAllocInfo
                        (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_b8);
    local_40 = (utf8char_t *)Memory::HeapAllocator::AllocT<true>(pHVar11,uVar13);
    if (local_40 != (utf8char_t *)0x0) {
      uVar6 = iJIT_GetNewMethodID();
      urlLength = CONCAT44(urlLength._4_4_,uVar6);
      local_48 = uVar13;
      utf8::EncodeIntoAndNullTerminate<(utf8::Utf8EncodingKind)0>
                (local_40,uVar13,local_2f8,(uint32)sVar9);
      puStack_80 = local_40;
      local_78 = Js::EntryPointInfo::GetNativeAddress(&entryPoint->super_EntryPointInfo);
      pVar12 = Js::EntryPointInfo::GetCodeSize(&entryPoint->super_EntryPointInfo);
      uStack_70 = CONCAT44(uStack_70._4_4_,(int)pVar12);
      iVar7 = Js::EntryPointInfo::GetNativeOffsetMapCount(&entryPoint->super_EntryPointInfo);
      local_b8 = (undefined1  [8])&_LineNumberInfo::typeinfo;
      data.typeinfo = (type_info *)0x0;
      uVar13 = (ulong)(iVar7 * 2 + 1);
      data.count = (size_t)anon_var_dwarf_31dec53;
      data.filename._0_4_ = 0x51;
      data.plusSize = uVar13;
      pHVar11 = Memory::HeapAllocator::TrackAllocInfo
                          (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_b8);
      obj = (TrackAllocData *)Memory::HeapAllocator::AllocT<true>(pHVar11,uVar13 * 8);
      if ((obj == (TrackAllocData *)0x0) || (DAT_01433313 == '\x01')) {
        local_b8 = (undefined1  [8])((ulong)local_34 << 0x20);
        uVar8 = 1;
        local_68 = (TrackAllocData *)local_b8;
      }
      else {
        uVar8 = Js::EntryPointInfo::PopulateLineInfo(&entryPoint->super_EntryPointInfo,obj,body);
        local_68 = obj;
      }
      uStack_70 = CONCAT44(uVar8,(undefined4)uStack_70);
      data.line = 0;
      data._36_4_ = 0;
      buffer = GetUrl(body,(size_t *)&data.line);
      puStack_50 = buffer;
      Output::Trace(ProfilerPhase,L"Method load event: %s\n",local_2f8);
      iJIT_NotifyEvent(iJVM_EVENT_TYPE_METHOD_LOAD_FINISHED,&urlLength);
      Memory::DeleteArray<Memory::HeapAllocator,_LineNumberInfo>
                (&Memory::HeapAllocator::Instance,uVar13,(_LineNumberInfo *)obj);
      if (data._32_8_ != 0) {
        Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,buffer,data._32_8_);
      }
      Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,local_40,local_48);
    }
  }
  return;
}

Assistant:

void VTuneChakraProfile::LogMethodNativeLoadEvent(Js::FunctionBody* body, Js::FunctionEntryPointInfo* entryPoint)
{
#if ENABLE_NATIVE_CODEGEN
    if (isJitProfilingActive)
    {
        iJIT_Method_Load methodInfo;
        memset(&methodInfo, 0, sizeof(iJIT_Method_Load));
        const char16* methodName = body->GetExternalDisplayName();
        // Append function line number info to method name so that VTune can distinguish between polymorphic methods
        char16 methodNameBuffer[_MAX_PATH];
        ULONG lineNumber = body->GetLineNumber();
        char16 numberBuffer[20];
        _ltow_s(lineNumber, numberBuffer, 10);
        wcscpy_s(methodNameBuffer, methodName);
        if (entryPoint->GetJitMode() == ExecutionMode::SimpleJit)
        {
            wcscat_s(methodNameBuffer, _u(" Simple"));
        }
        wcscat_s(methodNameBuffer, _u(" {line:"));
        wcscat_s(methodNameBuffer, numberBuffer);
        wcscat_s(methodNameBuffer, _u("}"));

        size_t methodLength = wcslen(methodNameBuffer);
        Assert(methodLength < _MAX_PATH);
        charcount_t ccMethodLength = static_cast<charcount_t>(methodLength);
        size_t cbUtf8MethodName = UInt32Math::MulAdd<3, 1>(ccMethodLength);
        utf8char_t* utf8MethodName = HeapNewNoThrowArray(utf8char_t, cbUtf8MethodName);
        if (utf8MethodName)
        {
            methodInfo.method_id = iJIT_GetNewMethodID();
            utf8::EncodeIntoAndNullTerminate<utf8::Utf8EncodingKind::Cesu8>(utf8MethodName, cbUtf8MethodName, methodNameBuffer, ccMethodLength);
            methodInfo.method_name = (char*)utf8MethodName;
            methodInfo.method_load_address = (void*)entryPoint->GetNativeAddress();
            methodInfo.method_size = (uint)entryPoint->GetCodeSize();        // Size in memory - Must be exact

            LineNumberInfo numberInfo[1];

            uint lineCount = (entryPoint->GetNativeOffsetMapCount()) * 2 + 1; // may need to record both .begin and .end for all elements
            LineNumberInfo* pLineInfo = HeapNewNoThrowArray(LineNumberInfo, lineCount);

            if (pLineInfo == NULL || Js::Configuration::Global.flags.DisableVTuneSourceLineInfo)
            {
                // resort to original implementation, attribute all samples to first line
                numberInfo[0].LineNumber = lineNumber;
                numberInfo[0].Offset = 0;
                methodInfo.line_number_size = 1;
                methodInfo.line_number_table = numberInfo;
            }
            else
            {
                int size = entryPoint->PopulateLineInfo(pLineInfo, body);
                methodInfo.line_number_size = size;
                methodInfo.line_number_table = pLineInfo;
            }

            size_t urlLength = 0;
            utf8char_t* utf8Url = GetUrl(body, &urlLength);
            methodInfo.source_file_name = (char*)utf8Url;
            OUTPUT_TRACE(Js::ProfilerPhase, _u("Method load event: %s\n"), methodNameBuffer);
            iJIT_NotifyEvent(iJVM_EVENT_TYPE_METHOD_LOAD_FINISHED, &methodInfo);

            HeapDeleteArray(lineCount, pLineInfo);

            if (urlLength > 0)
            {
                HeapDeleteArray(urlLength, utf8Url);
            }

            HeapDeleteArray(cbUtf8MethodName, utf8MethodName);
        }
    }
#endif
}